

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CService::GetSockAddr(CService *this,sockaddr *paddr,socklen_t *addrlen)

{
  Network NVar1;
  long lVar2;
  bool bVar3;
  sa_family_t sVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = (this->super_CNetAddr).m_net;
  if ((NVar1 == NET_CJDNS) || (NVar1 == NET_IPV6)) {
    if (0x1b < *addrlen) {
      *addrlen = 0x1c;
      *(undefined8 *)(paddr->sa_data + 10) = 0;
      paddr[1].sa_data[2] = '\0';
      paddr[1].sa_data[3] = '\0';
      paddr[1].sa_data[4] = '\0';
      paddr[1].sa_data[5] = '\0';
      paddr[1].sa_data[6] = '\0';
      paddr[1].sa_data[7] = '\0';
      paddr[1].sa_data[8] = '\0';
      paddr[1].sa_data[9] = '\0';
      paddr->sa_family = 0;
      paddr->sa_data[0] = '\0';
      paddr->sa_data[1] = '\0';
      paddr->sa_data[2] = '\0';
      paddr->sa_data[3] = '\0';
      paddr->sa_data[4] = '\0';
      paddr->sa_data[5] = '\0';
      paddr->sa_data[6] = '\0';
      paddr->sa_data[7] = '\0';
      paddr->sa_data[8] = '\0';
      paddr->sa_data[9] = '\0';
      paddr->sa_data[10] = '\0';
      paddr->sa_data[0xb] = '\0';
      paddr->sa_data[0xc] = '\0';
      paddr->sa_data[0xd] = '\0';
      bVar3 = CNetAddr::GetIn6Addr(&this->super_CNetAddr,(in6_addr *)(paddr->sa_data + 6));
      if (bVar3) {
        *(uint32_t *)(paddr[1].sa_data + 6) = (this->super_CNetAddr).m_scope_id;
        sVar4 = 10;
        goto LAB_00d5064c;
      }
    }
  }
  else if ((NVar1 == NET_IPV4) && (0xf < *addrlen)) {
    *addrlen = 0x10;
    paddr->sa_family = 0;
    paddr->sa_data[0] = '\0';
    paddr->sa_data[1] = '\0';
    paddr->sa_data[2] = '\0';
    paddr->sa_data[3] = '\0';
    paddr->sa_data[4] = '\0';
    paddr->sa_data[5] = '\0';
    paddr->sa_data[6] = '\0';
    paddr->sa_data[7] = '\0';
    paddr->sa_data[8] = '\0';
    paddr->sa_data[9] = '\0';
    paddr->sa_data[10] = '\0';
    paddr->sa_data[0xb] = '\0';
    paddr->sa_data[0xc] = '\0';
    paddr->sa_data[0xd] = '\0';
    bVar3 = CNetAddr::GetInAddr(&this->super_CNetAddr,(in_addr *)(paddr->sa_data + 2));
    sVar4 = 2;
    if (bVar3) {
LAB_00d5064c:
      paddr->sa_family = sVar4;
      *(uint16_t *)paddr->sa_data = this->port << 8 | this->port >> 8;
      bVar3 = true;
      goto LAB_00d50662;
    }
  }
  bVar3 = false;
LAB_00d50662:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CService::GetSockAddr(struct sockaddr* paddr, socklen_t *addrlen) const
{
    if (IsIPv4()) {
        if (*addrlen < (socklen_t)sizeof(struct sockaddr_in))
            return false;
        *addrlen = sizeof(struct sockaddr_in);
        struct sockaddr_in *paddrin = (struct sockaddr_in*)paddr;
        memset(paddrin, 0, *addrlen);
        if (!GetInAddr(&paddrin->sin_addr))
            return false;
        paddrin->sin_family = AF_INET;
        paddrin->sin_port = htons(port);
        return true;
    }
    if (IsIPv6() || IsCJDNS()) {
        if (*addrlen < (socklen_t)sizeof(struct sockaddr_in6))
            return false;
        *addrlen = sizeof(struct sockaddr_in6);
        struct sockaddr_in6 *paddrin6 = (struct sockaddr_in6*)paddr;
        memset(paddrin6, 0, *addrlen);
        if (!GetIn6Addr(&paddrin6->sin6_addr))
            return false;
        paddrin6->sin6_scope_id = m_scope_id;
        paddrin6->sin6_family = AF_INET6;
        paddrin6->sin6_port = htons(port);
        return true;
    }
    return false;
}